

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O0

void __thiscall PathTracerThread::SetPause(PathTracerThread *this,bool pause)

{
  bool bVar1;
  __sighandler_t __handler;
  byte in_SIL;
  uint __sig;
  atomic<bool> *in_RDI;
  double dVar2;
  memory_order unaff_retaddr;
  undefined1 unaff_retaddr_00;
  undefined7 in_stack_00000008;
  
  bVar1 = std::atomic::operator_cast_to_bool(in_RDI);
  if ((bool)(in_SIL & 1) != bVar1) {
    dVar2 = glfwGetTime();
    *(double *)(in_RDI + 0x108) = dVar2 - *(double *)(in_RDI + 0x108);
    __sig = (uint)(in_SIL & 1);
    std::atomic<bool>::store
              ((atomic<bool> *)CONCAT17(pause,in_stack_00000008),(bool)unaff_retaddr_00,
               unaff_retaddr);
    spdlog::debug<char[25]>((char (*) [25])0x1808b5);
    binary_semaphore::signal((binary_semaphore *)(in_RDI + 0x40),__sig,__handler);
  }
  return;
}

Assistant:

void PathTracerThread::SetPause(bool pause) {
	if (pause == m_pause)
		return;
	m_time = glfwGetTime() - m_time;
	m_pause.store(pause, std::memory_order_release);

	spdlog::debug("m_pause_semaphore signal");
	m_pause_semaphore.signal();
}